

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::TimeType::TimeType(TimeType *this,TimeType *other44)

{
  _TimeUnit__isset *p_Var1;
  
  *(undefined ***)this = &PTR__TimeType_02483f28;
  *(undefined ***)&this->unit = &PTR__TimeUnit_02483e58;
  (this->unit).MILLIS = (MilliSeconds)&PTR__MilliSeconds_02483d20;
  (this->unit).MICROS = (MicroSeconds)&PTR__MicroSeconds_02483d88;
  (this->unit).NANOS = (NanoSeconds)&PTR__NanoSeconds_02483df0;
  p_Var1 = &(this->unit).__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  this->isAdjustedToUTC = other44->isAdjustedToUTC;
  (this->unit).__isset = (other44->unit).__isset;
  return;
}

Assistant:

TimeType::TimeType(const TimeType& other44) noexcept {
  isAdjustedToUTC = other44.isAdjustedToUTC;
  unit = other44.unit;
}